

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

void __thiscall
Memory::HeapBlockMap32::ClearHeapBlock(HeapBlockMap32 *this,void *address,uint pageCount)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  L2MapChunk *this_00;
  uint pageCount_00;
  uint id2;
  ulong uVar4;
  undefined8 *in_FS_OFFSET;
  
  uVar4 = (ulong)address >> 0x14 & 0xfff;
  id2 = (uint)address >> 0xc & 0xff;
  pageCount_00 = 0x100 - id2;
  if (pageCount <= 0x100 - id2) {
    pageCount_00 = pageCount;
  }
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  while( true ) {
    this_00 = this->map[uVar4];
    if (this_00 == (L2MapChunk *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                         ,0x92,"(map[id1] != nullptr)","map[id1] != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
      this_00 = this->map[uVar4];
    }
    L2MapChunk::Clear(this_00,id2,pageCount_00);
    pageCount = pageCount - pageCount_00;
    if (pageCount == 0) break;
    uVar4 = (ulong)((int)uVar4 + 1);
    pageCount_00 = 0x100;
    if (pageCount < 0x100) {
      pageCount_00 = pageCount;
    }
    id2 = 0;
  }
  return;
}

Assistant:

void
HeapBlockMap32::ClearHeapBlock(void * address, uint pageCount)
{
    uint id1 = GetLevel1Id(address);
    uint id2 = GetLevel2Id(address);

    uint currentPageCount = min(pageCount, L2Count - id2);

    while (true)
    {
        Assert(map[id1] != nullptr);

        map[id1]->Clear(id2, currentPageCount);

        pageCount -= currentPageCount;
        if (pageCount == 0)
        {
            return;
        }

        id2 = 0;
        id1++;
        currentPageCount = min(pageCount, L2Count);
    }
}